

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViaCoroutine.h
# Opt level: O0

ValueAwaiter
async_simple::coro::detail::coAwait<async_simple::coro::Lazy<void>>
          (Executor *ex,Lazy<void> *awaitable)

{
  Lazy<void> *in_RDX;
  Handle in_RDI;
  Executor *in_stack_ffffffffffffffe0;
  
  Lazy<void>::coAwait(in_RDX,in_stack_ffffffffffffffe0);
  getAwaiter<async_simple::coro::detail::LazyBase<void,false>::ValueAwaiter>
            ((ValueAwaiter *)in_RDI.__handle_);
  LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x1939f3);
  return (ValueAwaiter)(Handle)in_RDI.__handle_;
}

Assistant:

inline auto coAwait(Executor* ex, Awaitable&& awaitable) {
    if constexpr (detail::HasCoAwaitMethod<Awaitable>) {
        return detail::getAwaiter(
            std::forward<Awaitable>(awaitable).coAwait(ex));
    } else {
        using AwaiterType =
            decltype(detail::getAwaiter(std::forward<Awaitable>(awaitable)));
        return ViaAsyncAwaiter<std::decay_t<AwaiterType>>(
            ex, std::forward<Awaitable>(awaitable));
    }
}